

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportText.cpp
# Opt level: O0

string * __thiscall
oout::GtestReportText::asString_abi_cxx11_(string *__return_storage_ptr__,GtestReportText *this)

{
  size_t sVar1;
  ostream *poVar2;
  element_type *peVar3;
  CountFailure local_1f8;
  size_t local_1e8;
  size_t failure_count;
  FmtText local_1c0;
  FmtText format;
  ostringstream out;
  CountTest local_30;
  size_t local_20;
  size_t test_count;
  GtestReportText *this_local;
  
  test_count = (size_t)this;
  this_local = (GtestReportText *)__return_storage_ptr__;
  CountTest::CountTest(&local_30,&this->result);
  sVar1 = CountTest::count(&local_30);
  CountTest::~CountTest(&local_30);
  local_20 = sVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&format);
  poVar2 = std::operator<<((ostream *)&format,"[==========] Running ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2," tests");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  FmtText::FmtText(&local_1c0);
  peVar3 = std::__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->result);
  (*peVar3->_vptr_Result[2])(&failure_count,peVar3,&local_1c0);
  std::operator<<((ostream *)&format,(string *)&failure_count);
  std::__cxx11::string::~string((string *)&failure_count);
  poVar2 = std::operator<<((ostream *)&format,"[==========] ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2," tests ran.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  CountFailure::CountFailure(&local_1f8,&this->result);
  sVar1 = CountFailure::count(&local_1f8);
  CountFailure::~CountFailure(&local_1f8);
  local_1e8 = sVar1;
  poVar2 = std::operator<<((ostream *)&format,"[  PASSED  ] ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20 - local_1e8);
  poVar2 = std::operator<<(poVar2," test.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (local_1e8 != 0) {
    poVar2 = std::operator<<((ostream *)&format,"[  FAILED  ] ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1e8);
    poVar2 = std::operator<<(poVar2," test.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&format,local_1e8);
    poVar2 = std::operator<<(poVar2," FAILED TEST");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::ostringstream::str();
  FmtText::~FmtText(&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&format);
  return __return_storage_ptr__;
}

Assistant:

string GtestReportText::asString() const
{
	const auto test_count = CountTest(result).count();
	ostringstream out;
	// @todo #82:15min gtest count of test cases. Is it need for me?
	out << "[==========] Running " << test_count << " tests" << endl;
	FmtText format;
	out << result->print(format);
	// @todo #82:15min gtest show total seconds.
	//  I have root suite, and this value show on inner level
	out << "[==========] " << test_count << " tests ran." << endl;

	const auto failure_count = CountFailure(result).count();
	out << "[  PASSED  ] " << test_count - failure_count << " test." << endl;
	if (failure_count > 0) {
		out << "[  FAILED  ] " << failure_count << " test." << endl;
		// @todo #82:15min gtest show list of failure tests.
		//  I can do this with special formatter
		out << failure_count << " FAILED TEST" << endl;
	}
	return out.str();
}